

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlsavoCtrl.cpp
# Opt level: O3

void __thiscall
AlsavoSession::SendPacket
          (AlsavoSession *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *payload,
          PacketResponseCB *onResponse,uint16_t cmd)

{
  undefined8 uVar1;
  pointer __src;
  ushort uVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> outBuf;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  CLI::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&local_48,
             (size_type)
             ((payload->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_finish +
             (0x10 - (long)(payload->
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_start)));
  uVar2 = (short)*(undefined4 *)
                  &(payload->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
          (short)*(undefined4 *)
                  &(payload->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_start;
  uVar1 = *(undefined8 *)&this->m_CSID;
  local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0] = '2';
  local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[1] = '\0';
  local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[2] = '\0';
  local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[3] = '\0';
  *(undefined8 *)
   (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start + 4) = uVar1;
  *(uint16_t *)
   (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start + 0xc) = cmd << 8 | cmd >> 8;
  *(ushort *)
   (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start + 0xe) = uVar2 * 0x100 | uVar2 >> 8;
  __src = (payload->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
          super__Vector_impl_data._M_start;
  memcpy(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start + 0x10,__src,
         (ulong)(*(int *)&(payload->
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                          .super__Vector_impl_data._M_finish - (int)__src & 0xffff));
  std::deque<AlsavoSession::PacketQueueItem,std::allocator<AlsavoSession::PacketQueueItem>>::
  emplace_back<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::function<void(std::vector<unsigned_char,std::allocator<unsigned_char>>const&,int)>&>
            ((deque<AlsavoSession::PacketQueueItem,std::allocator<AlsavoSession::PacketQueueItem>> *
             )&this->m_OutQueue,&local_48,onResponse);
  if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void SendPacket(const std::vector<unsigned char> &payload, PacketResponseCB onResponse, uint16_t cmd = 0xf4)
	{
		std::vector<unsigned char> outBuf;
		outBuf.resize(sizeof(PacketHeader) + payload.size());
		PacketHeader hdr(0x32, 0, m_CSID, m_DSID, cmd, (uint16_t)payload.size());
		memcpy(outBuf.data(), &hdr, sizeof(PacketHeader));
		memcpy(outBuf.data() + sizeof(PacketHeader), payload.data(), (uint16_t)payload.size());
		m_OutQueue.emplace_back(std::move(outBuf), onResponse);
	}